

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

void * Curl_hash_add2(Curl_hash *h,void *key,size_t key_len,void *p,Curl_hash_elem_dtor dtor)

{
  Curl_hash_element *pCVar1;
  void *pvVar2;
  Curl_hash_element **ppCVar3;
  size_t sVar4;
  Curl_hash_element *pCVar5;
  
  if (h->table == (Curl_hash_element **)0x0) {
    ppCVar3 = (Curl_hash_element **)(*Curl_ccalloc)(h->slots,8);
    h->table = ppCVar3;
    if (ppCVar3 == (Curl_hash_element **)0x0) {
      return (void *)0x0;
    }
  }
  ppCVar3 = h->table;
  sVar4 = (*h->hash_func)(key,key_len,h->slots);
  pCVar1 = (Curl_hash_element *)(ppCVar3 + sVar4);
  pCVar5 = pCVar1;
  while (pCVar5 = pCVar5->next, pCVar5 != (Curl_hash_element *)0x0) {
    sVar4 = (*h->comp_func)(pCVar5->key,pCVar5->key_len,key,key_len);
    if (sVar4 != 0) {
      pvVar2 = pCVar5->ptr;
      if (pvVar2 != (void *)0x0) {
        if (pCVar5->dtor == (Curl_hash_elem_dtor)0x0) {
          (*h->dtor)(pvVar2);
        }
        else {
          (*pCVar5->dtor)(pCVar5->key,pCVar5->key_len,pvVar2);
        }
        pCVar5->ptr = (void *)0x0;
      }
      pCVar5->ptr = p;
      pCVar5->dtor = dtor;
      return p;
    }
  }
  pCVar5 = (Curl_hash_element *)(*Curl_cmalloc)(key_len + 0x28);
  if (pCVar5 == (Curl_hash_element *)0x0) {
    return (void *)0x0;
  }
  pCVar5->next = (Curl_hash_element *)0x0;
  memcpy(pCVar5->key,key,key_len);
  pCVar5->key_len = key_len;
  pCVar5->ptr = p;
  pCVar5->dtor = dtor;
  pCVar5->next = pCVar1->next;
  pCVar1->next = pCVar5;
  h->size = h->size + 1;
  return p;
}

Assistant:

void *Curl_hash_add2(struct Curl_hash *h, void *key, size_t key_len, void *p,
                     Curl_hash_elem_dtor dtor)
{
  struct Curl_hash_element *he, **slot;

  DEBUGASSERT(h);
  DEBUGASSERT(h->slots);
  DEBUGASSERT(h->init == HASHINIT);
  if(!h->table) {
    h->table = calloc(h->slots, sizeof(struct Curl_hash_element *));
    if(!h->table)
      return NULL; /* OOM */
  }

  slot = CURL_HASH_SLOT_ADDR(h, key, key_len);
  for(he = *slot; he; he = he->next) {
    if(h->comp_func(he->key, he->key_len, key, key_len)) {
      /* existing key entry, overwrite by clearing old pointer */
      hash_elem_clear_ptr(h, he);
      he->ptr = (void *)p;
      he->dtor = dtor;
      return p;
    }
  }

  he = hash_elem_create(key, key_len, p, dtor);
  if(!he)
    return NULL; /* OOM */

  hash_elem_link(h, slot, he);
  return p; /* return the new entry */
}